

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alp.cpp
# Opt level: O3

CompressionFunction * duckdb::GetAlpFunction<float>(PhysicalType data_type)

{
  CompressionFunction *in_RDI;
  
  in_RDI->type = COMPRESSION_ALP;
  in_RDI->data_type = data_type;
  in_RDI->init_analyze = AlpInitAnalyze<float>;
  in_RDI->analyze = AlpAnalyze<float>;
  in_RDI->final_analyze = AlpFinalAnalyze<float>;
  in_RDI->init_compression = AlpInitCompression<float>;
  in_RDI->compress = AlpCompress<float>;
  in_RDI->compress_finalize = AlpFinalizeCompress<float>;
  in_RDI->init_prefetch = (compression_init_prefetch_t)0x0;
  in_RDI->init_scan = AlpInitScan<float>;
  in_RDI->scan_vector = AlpScan<float>;
  in_RDI->scan_partial = AlpScanPartial<float>;
  in_RDI->select = (compression_select_t)0x0;
  in_RDI->filter = (compression_filter_t)0x0;
  in_RDI->fetch_row = AlpFetchRow<float>;
  in_RDI->skip = AlpSkip<float>;
  in_RDI->init_segment = (compression_init_segment_t)0x0;
  in_RDI->init_append = (compression_init_append_t)0x0;
  in_RDI->append = (compression_append_t)0x0;
  in_RDI->finalize_append = (compression_finalize_append_t)0x0;
  in_RDI->revert_append = (compression_revert_append_t)0x0;
  in_RDI->serialize_state = (compression_serialize_state_t)0x0;
  in_RDI->deserialize_state = (compression_deserialize_state_t)0x0;
  in_RDI->cleanup_state = (compression_cleanup_state_t)0x0;
  *(undefined8 *)((long)&in_RDI->cleanup_state + 1) = 0;
  *(undefined8 *)((long)&in_RDI->get_segment_info + 1) = 0;
  return in_RDI;
}

Assistant:

CompressionFunction GetAlpFunction<float>(PhysicalType data_type) {
	return CompressionFunction(CompressionType::COMPRESSION_ALP, data_type, AlpInitAnalyze<float>, AlpAnalyze<float>,
	                           AlpFinalAnalyze<float>, AlpInitCompression<float>, AlpCompress<float>,
	                           AlpFinalizeCompress<float>, AlpInitScan<float>, AlpScan<float>, AlpScanPartial<float>,
	                           AlpFetchRow<float>, AlpSkip<float>);
}